

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::yarn4>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,yarn4 *r1,yarn4 *r2,long N,long skip1,long skip2)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  uint local_ac;
  yarn4 *local_a8;
  yarn4 *local_a0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_a8 = r2;
  local_a0 = r1;
  local_58 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_50 = N;
  local_48 = skip1;
  local_40 = skip2;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_78,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_98,N);
    lVar8 = 0;
    do {
      lVar12 = lVar8;
      iVar9 = (local_a0->S).r[0];
      iVar1 = (local_a0->S).r[1];
      iVar11 = (local_a0->S).r[2];
      uVar6 = (long)(local_a0->S).r[3] * (long)(local_a0->P).a[3] +
              (long)(local_a0->P).a[2] * (long)iVar11 +
              (long)(local_a0->P).a[1] * (long)iVar1 + (long)(local_a0->P).a[0] * (long)iVar9;
      (local_a0->S).r[3] = iVar11;
      (local_a0->S).r[2] = iVar1;
      uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
      uVar6 = uVar7 - 0x1fffffffc;
      if (uVar7 < 0x1fffffffc) {
        uVar6 = uVar7;
      }
      uVar7 = uVar6 - 0xfffffffe;
      if (uVar6 < 0xfffffffe) {
        uVar7 = uVar6;
      }
      uVar5 = (uint)uVar7 + 0x80000001;
      if (uVar7 < 0x7fffffff) {
        uVar5 = (uint)uVar7;
      }
      (local_a0->S).r[1] = iVar9;
      (local_a0->S).r[0] = uVar5;
      local_ac = 0;
      if (uVar5 != 0) {
        uVar2 = (uint)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar5 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000)) &
                0x7fffffff;
        iVar9 = (int)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar5 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000) >>
                     0x1f);
        uVar5 = uVar2 + iVar9;
        local_ac = uVar2 + 0x80000001 + iVar9;
        if (uVar5 < 0x7fffffff) {
          local_ac = uVar5;
        }
      }
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_ac);
      }
      else {
        *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_ac;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar9 = (local_a8->S).r[0];
      iVar1 = (local_a8->S).r[1];
      iVar11 = (local_a8->S).r[2];
      uVar6 = (long)(local_a8->S).r[3] * (long)(local_a8->P).a[3] +
              (long)(local_a8->P).a[2] * (long)iVar11 +
              (long)(local_a8->P).a[1] * (long)iVar1 + (long)(local_a8->P).a[0] * (long)iVar9;
      (local_a8->S).r[3] = iVar11;
      uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
      uVar6 = uVar7 - 0x1fffffffc;
      if (uVar7 < 0x1fffffffc) {
        uVar6 = uVar7;
      }
      uVar7 = uVar6 - 0xfffffffe;
      if (uVar6 < 0xfffffffe) {
        uVar7 = uVar6;
      }
      (local_a8->S).r[2] = iVar1;
      (local_a8->S).r[1] = iVar9;
      uVar5 = (uint)uVar7 + 0x80000001;
      if (uVar7 < 0x7fffffff) {
        uVar5 = (uint)uVar7;
      }
      (local_a8->S).r[0] = uVar5;
      if (uVar5 == 0) {
        local_ac = 0;
      }
      else {
        uVar2 = (uint)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar5 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000)) &
                0x7fffffff;
        iVar9 = (int)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar5 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000) >>
                     0x1f);
        uVar5 = uVar2 + iVar9;
        local_ac = uVar2 + 0x80000001 + iVar9;
        if (uVar5 < 0x7fffffff) {
          local_ac = uVar5;
        }
      }
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_ac);
      }
      else {
        *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_ac;
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < local_48) {
        lVar8 = local_48;
        iVar9 = (local_a0->S).r[3];
        iVar1 = (local_a0->S).r[2];
        iVar11 = (local_a0->S).r[0];
        iVar10 = (local_a0->S).r[1];
        do {
          iVar4 = iVar10;
          iVar10 = iVar11;
          iVar3 = iVar1;
          uVar6 = (long)iVar9 * (long)(local_a0->P).a[3] + (long)iVar3 * (long)(local_a0->P).a[2] +
                  (long)iVar4 * (long)(local_a0->P).a[1] + (long)iVar10 * (long)(local_a0->P).a[0];
          uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
          uVar6 = uVar7 - 0x1fffffffc;
          if (uVar7 < 0x1fffffffc) {
            uVar6 = uVar7;
          }
          uVar7 = uVar6 - 0xfffffffe;
          if (uVar6 < 0xfffffffe) {
            uVar7 = uVar6;
          }
          iVar11 = (int)uVar7 + -0x7fffffff;
          if (uVar7 < 0x7fffffff) {
            iVar11 = (int)uVar7;
          }
          lVar8 = lVar8 + -1;
          iVar9 = iVar3;
          iVar1 = iVar4;
        } while (lVar8 != 0);
        (local_a0->S).r[3] = iVar3;
        (local_a0->S).r[2] = iVar4;
        (local_a0->S).r[1] = iVar10;
        (local_a0->S).r[0] = iVar11;
      }
      if (0 < local_40) {
        lVar8 = local_40;
        iVar9 = (local_a8->S).r[3];
        iVar1 = (local_a8->S).r[2];
        iVar11 = (local_a8->S).r[0];
        iVar10 = (local_a8->S).r[1];
        do {
          iVar4 = iVar10;
          iVar10 = iVar11;
          iVar3 = iVar1;
          uVar6 = (long)iVar9 * (long)(local_a8->P).a[3] + (long)iVar3 * (long)(local_a8->P).a[2] +
                  (long)iVar4 * (long)(local_a8->P).a[1] + (long)iVar10 * (long)(local_a8->P).a[0];
          uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
          uVar6 = uVar7 - 0x1fffffffc;
          if (uVar7 < 0x1fffffffc) {
            uVar6 = uVar7;
          }
          uVar7 = uVar6 - 0xfffffffe;
          if (uVar6 < 0xfffffffe) {
            uVar7 = uVar6;
          }
          iVar11 = (int)uVar7 + -0x7fffffff;
          if (uVar7 < 0x7fffffff) {
            iVar11 = (int)uVar7;
          }
          lVar8 = lVar8 + -1;
          iVar9 = iVar3;
          iVar1 = iVar4;
        } while (lVar8 != 0);
        (local_a8->S).r[3] = iVar3;
        (local_a8->S).r[2] = iVar4;
        (local_a8->S).r[1] = iVar10;
        (local_a8->S).r[0] = iVar11;
      }
      lVar8 = lVar12 + 1;
      local_38 = lVar12;
    } while (lVar12 + 1 != local_50);
  }
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_58,&local_78,&local_98);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         local_58;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}